

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

void __thiscall Messages::AddressBook::~AddressBook(AddressBook *this)

{
  ulong uVar1;
  LogMessage *pLVar2;
  LogFinisher local_41;
  LogMessage local_40 [56];
  
  uVar1 = *(ulong *)&this->field_0x8;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 != 0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O3/proto/messages.pb.cc"
               ,0x349);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_40,"CHECK failed: GetArena() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_41,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_40);
  }
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8);
  google::protobuf::RepeatedPtrField<Messages::Person>::~RepeatedPtrField(&this->people_);
  return;
}

Assistant:

AddressBook::~AddressBook() {
  // @@protoc_insertion_point(destructor:Messages.AddressBook)
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}